

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O1

PackageInfo * chatra::emb::math::packageInfo(void)

{
  long lVar1;
  PackageInfo *in_RDI;
  undefined1 *puVar2;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  undefined1 local_1a30 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a18;
  _Alloc_hider local_1a08;
  undefined1 local_1a00 [24];
  _Alloc_hider local_19e8;
  size_type local_19e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19d8;
  code *local_19c8;
  undefined1 *local_19c0;
  undefined8 local_19b8;
  undefined1 local_19b0 [16];
  uint *local_19a0;
  undefined8 local_1998;
  uint local_1990 [2];
  undefined4 uStack_1988;
  undefined4 uStack_1984;
  undefined1 *local_1980;
  undefined8 local_1978;
  undefined1 local_1970 [16];
  code *local_1960;
  undefined1 *local_1958;
  undefined8 local_1950;
  undefined1 local_1948 [16];
  uint *local_1938;
  undefined8 local_1930;
  uint local_1928 [2];
  undefined4 uStack_1920;
  undefined4 uStack_191c;
  undefined1 *local_1918;
  undefined8 local_1910;
  undefined1 local_1908 [16];
  code *local_18f8;
  undefined1 *local_18f0;
  undefined8 local_18e8;
  undefined1 local_18e0 [16];
  uint *local_18d0;
  undefined8 local_18c8;
  uint local_18c0 [2];
  undefined4 uStack_18b8;
  undefined4 uStack_18b4;
  undefined1 *local_18b0;
  undefined8 local_18a8;
  undefined1 local_18a0 [16];
  code *local_1890;
  undefined1 *local_1888;
  undefined8 local_1880;
  undefined1 local_1878 [16];
  uint *local_1868;
  undefined8 local_1860;
  uint local_1858 [2];
  undefined4 uStack_1850;
  undefined4 uStack_184c;
  undefined1 *local_1848;
  undefined8 local_1840;
  undefined1 local_1838 [16];
  code *local_1828;
  undefined1 *local_1820;
  undefined8 local_1818;
  undefined1 local_1810 [16];
  uint *local_1800;
  undefined8 local_17f8;
  uint local_17f0 [2];
  undefined4 uStack_17e8;
  undefined4 uStack_17e4;
  undefined1 *local_17e0;
  undefined8 local_17d8;
  undefined1 local_17d0 [16];
  code *local_17c0;
  undefined1 *local_17b8;
  undefined8 local_17b0;
  undefined1 local_17a8 [16];
  uint *local_1798;
  undefined8 local_1790;
  uint local_1788 [2];
  undefined4 uStack_1780;
  undefined4 uStack_177c;
  undefined1 *local_1778;
  undefined8 local_1770;
  undefined1 local_1768 [16];
  code *local_1758;
  undefined1 *local_1750;
  undefined8 local_1748;
  undefined1 local_1740 [16];
  uint *local_1730;
  undefined8 local_1728;
  uint local_1720 [2];
  undefined4 uStack_1718;
  undefined4 uStack_1714;
  undefined1 *local_1710;
  undefined8 local_1708;
  undefined1 local_1700 [16];
  code *local_16f0;
  undefined1 *local_16e8;
  undefined8 local_16e0;
  undefined1 local_16d8 [16];
  uint *local_16c8;
  undefined8 local_16c0;
  uint local_16b8 [2];
  undefined4 uStack_16b0;
  undefined4 uStack_16ac;
  undefined1 *local_16a8;
  undefined8 local_16a0;
  undefined1 local_1698 [16];
  code *local_1688;
  undefined1 *local_1680;
  undefined8 local_1678;
  undefined1 local_1670 [16];
  uint *local_1660;
  undefined8 local_1658;
  uint local_1650 [2];
  undefined4 uStack_1648;
  undefined4 uStack_1644;
  undefined1 *local_1640;
  undefined8 local_1638;
  undefined1 local_1630 [16];
  code *local_1620;
  undefined1 *local_1618;
  undefined8 local_1610;
  undefined1 local_1608 [16];
  uint *local_15f8;
  undefined8 local_15f0;
  uint local_15e8 [2];
  undefined4 uStack_15e0;
  undefined4 uStack_15dc;
  undefined1 *local_15d8;
  undefined8 local_15d0;
  undefined1 local_15c8 [16];
  code *local_15b8;
  undefined1 *local_15b0;
  undefined8 local_15a8;
  undefined1 local_15a0 [16];
  uint *local_1590;
  undefined8 local_1588;
  uint local_1580 [2];
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined1 *local_1570;
  undefined8 local_1568;
  undefined1 local_1560 [16];
  code *local_1550;
  undefined1 *local_1548;
  undefined8 local_1540;
  undefined1 local_1538 [16];
  uint *local_1528;
  undefined8 local_1520;
  uint local_1518 [2];
  undefined4 uStack_1510;
  undefined4 uStack_150c;
  undefined1 *local_1508;
  undefined8 local_1500;
  undefined1 local_14f8 [16];
  code *local_14e8;
  undefined1 *local_14e0;
  undefined8 local_14d8;
  undefined1 local_14d0 [16];
  uint *local_14c0;
  undefined8 local_14b8;
  uint local_14b0 [2];
  undefined4 uStack_14a8;
  undefined4 uStack_14a4;
  undefined1 *local_14a0;
  undefined8 local_1498;
  undefined1 local_1490 [16];
  code *local_1480;
  undefined1 *local_1478;
  undefined8 local_1470;
  undefined1 local_1468 [16];
  uint *local_1458;
  undefined8 local_1450;
  uint local_1448 [2];
  undefined4 uStack_1440;
  undefined4 uStack_143c;
  undefined1 *local_1438;
  undefined8 local_1430;
  undefined1 local_1428 [16];
  code *local_1418;
  undefined1 *local_1410;
  undefined8 local_1408;
  undefined1 local_1400 [16];
  uint *local_13f0;
  undefined8 local_13e8;
  uint local_13e0 [2];
  undefined4 uStack_13d8;
  undefined4 uStack_13d4;
  undefined1 *local_13d0;
  undefined8 local_13c8;
  undefined1 local_13c0 [16];
  code *local_13b0;
  undefined1 *local_13a8;
  undefined8 local_13a0;
  undefined1 local_1398 [16];
  uint *local_1388;
  undefined8 local_1380;
  uint local_1378 [2];
  undefined4 uStack_1370;
  undefined4 uStack_136c;
  undefined1 *local_1368;
  undefined8 local_1360;
  undefined1 local_1358 [16];
  code *local_1348;
  undefined1 *local_1340;
  undefined8 local_1338;
  undefined1 local_1330 [16];
  uint *local_1320;
  undefined8 local_1318;
  uint local_1310 [2];
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  undefined1 *local_1300;
  undefined8 local_12f8;
  undefined1 local_12f0 [16];
  code *local_12e0;
  undefined1 *local_12d8;
  undefined8 local_12d0;
  undefined1 local_12c8 [16];
  uint *local_12b8;
  undefined8 local_12b0;
  uint local_12a8 [2];
  undefined4 uStack_12a0;
  undefined4 uStack_129c;
  undefined1 *local_1298;
  undefined8 local_1290;
  undefined1 local_1288 [16];
  code *local_1278;
  undefined1 *local_1270;
  undefined8 local_1268;
  undefined1 local_1260 [16];
  uint *local_1250;
  undefined8 local_1248;
  uint local_1240 [2];
  undefined4 uStack_1238;
  undefined4 uStack_1234;
  undefined1 *local_1230;
  undefined8 local_1228;
  undefined1 local_1220 [16];
  code *local_1210;
  undefined1 *local_1208;
  undefined8 local_1200;
  undefined1 local_11f8 [16];
  uint *local_11e8;
  undefined8 local_11e0;
  uint local_11d8 [2];
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  undefined1 *local_11c8;
  undefined8 local_11c0;
  undefined1 local_11b8 [16];
  code *local_11a8;
  undefined1 *local_11a0;
  undefined8 local_1198;
  undefined1 local_1190 [16];
  uint *local_1180;
  undefined8 local_1178;
  uint local_1170 [2];
  undefined4 uStack_1168;
  undefined4 uStack_1164;
  undefined1 *local_1160;
  undefined8 local_1158;
  undefined1 local_1150 [16];
  code *local_1140;
  undefined1 *local_1138;
  undefined8 local_1130;
  undefined1 local_1128 [16];
  uint *local_1118;
  undefined8 local_1110;
  uint local_1108 [2];
  undefined4 uStack_1100;
  undefined4 uStack_10fc;
  undefined1 *local_10f8;
  undefined8 local_10f0;
  undefined1 local_10e8 [16];
  code *local_10d8;
  undefined1 *local_10d0;
  undefined8 local_10c8;
  undefined1 local_10c0 [16];
  uint *local_10b0;
  undefined8 local_10a8;
  uint local_10a0 [2];
  undefined4 uStack_1098;
  undefined4 uStack_1094;
  undefined1 *local_1090;
  undefined8 local_1088;
  undefined1 local_1080 [16];
  code *local_1070;
  undefined1 *local_1068;
  undefined8 local_1060;
  undefined1 local_1058 [16];
  uint *local_1048;
  undefined8 local_1040;
  uint local_1038 [2];
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined1 *local_1028;
  undefined8 local_1020;
  undefined1 local_1018 [16];
  code *local_1008;
  undefined1 *local_1000;
  undefined8 local_ff8;
  undefined1 local_ff0 [16];
  uint *local_fe0;
  undefined8 local_fd8;
  uint local_fd0 [2];
  undefined4 uStack_fc8;
  undefined4 uStack_fc4;
  undefined1 *local_fc0;
  undefined8 local_fb8;
  undefined1 local_fb0 [16];
  code *local_fa0;
  undefined1 *local_f98;
  undefined8 local_f90;
  undefined1 local_f88 [16];
  uint *local_f78;
  undefined8 local_f70;
  uint local_f68 [2];
  undefined4 uStack_f60;
  undefined4 uStack_f5c;
  undefined1 *local_f58;
  undefined8 local_f50;
  undefined1 local_f48 [16];
  code *local_f38;
  undefined1 *local_f30;
  undefined8 local_f28;
  undefined1 local_f20 [16];
  uint *local_f10;
  undefined8 local_f08;
  uint local_f00 [2];
  undefined4 uStack_ef8;
  undefined4 uStack_ef4;
  undefined1 *local_ef0;
  undefined8 local_ee8;
  undefined1 local_ee0 [16];
  code *local_ed0;
  undefined1 *local_ec8;
  undefined8 local_ec0;
  undefined1 local_eb8 [16];
  uint *local_ea8;
  undefined8 local_ea0;
  uint local_e98 [2];
  undefined4 uStack_e90;
  undefined4 uStack_e8c;
  undefined1 *local_e88;
  undefined8 local_e80;
  undefined1 local_e78 [16];
  code *local_e68;
  undefined1 *local_e60;
  undefined8 local_e58;
  undefined1 local_e50 [16];
  uint *local_e40;
  undefined8 local_e38;
  uint local_e30 [2];
  undefined4 uStack_e28;
  undefined4 uStack_e24;
  undefined1 *local_e20;
  undefined8 local_e18;
  undefined1 local_e10 [16];
  code *local_e00;
  undefined1 *local_df8;
  undefined8 local_df0;
  undefined1 local_de8 [16];
  uint *local_dd8;
  undefined8 local_dd0;
  uint local_dc8 [2];
  undefined4 uStack_dc0;
  undefined4 uStack_dbc;
  undefined1 *local_db8;
  undefined8 local_db0;
  undefined1 local_da8 [16];
  code *local_d98;
  undefined1 *local_d90;
  undefined8 local_d88;
  undefined1 local_d80 [16];
  uint *local_d70;
  undefined8 local_d68;
  uint local_d60 [2];
  undefined4 uStack_d58;
  undefined4 uStack_d54;
  undefined1 *local_d50;
  undefined8 local_d48;
  undefined1 local_d40 [16];
  code *local_d30;
  undefined1 *local_d28;
  undefined8 local_d20;
  undefined1 local_d18 [16];
  uint *local_d08;
  undefined8 local_d00;
  uint local_cf8 [2];
  undefined4 uStack_cf0;
  undefined4 uStack_cec;
  undefined1 *local_ce8;
  undefined8 local_ce0;
  undefined1 local_cd8 [16];
  code *local_cc8;
  undefined1 *local_cc0;
  undefined8 local_cb8;
  undefined1 local_cb0 [16];
  uint *local_ca0;
  undefined8 local_c98;
  uint local_c90 [2];
  undefined4 uStack_c88;
  undefined4 uStack_c84;
  undefined1 *local_c80;
  undefined8 local_c78;
  undefined1 local_c70 [16];
  code *local_c60;
  undefined1 *local_c58;
  undefined8 local_c50;
  undefined1 local_c48 [16];
  uint *local_c38;
  undefined8 local_c30;
  uint local_c28 [2];
  undefined4 uStack_c20;
  undefined4 uStack_c1c;
  undefined1 *local_c18;
  undefined8 local_c10;
  undefined1 local_c08 [16];
  code *local_bf8;
  undefined1 *local_bf0;
  undefined8 local_be8;
  undefined1 local_be0 [16];
  uint *local_bd0;
  undefined8 local_bc8;
  uint local_bc0 [2];
  undefined4 uStack_bb8;
  undefined4 uStack_bb4;
  undefined1 *local_bb0;
  undefined8 local_ba8;
  undefined1 local_ba0 [16];
  code *local_b90;
  undefined1 *local_b88;
  undefined8 local_b80;
  undefined1 local_b78 [16];
  uint *local_b68;
  undefined8 local_b60;
  uint local_b58 [2];
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined1 *local_b48;
  undefined8 local_b40;
  undefined1 local_b38 [16];
  code *local_b28;
  undefined1 *local_b20;
  undefined8 local_b18;
  undefined1 local_b10 [16];
  uint *local_b00;
  undefined8 local_af8;
  uint local_af0 [2];
  undefined4 uStack_ae8;
  undefined4 uStack_ae4;
  undefined1 *local_ae0;
  undefined8 local_ad8;
  undefined1 local_ad0 [16];
  code *local_ac0;
  undefined1 *local_ab8;
  undefined8 local_ab0;
  undefined1 local_aa8 [16];
  uint *local_a98;
  undefined8 local_a90;
  uint local_a88 [2];
  undefined4 uStack_a80;
  undefined4 uStack_a7c;
  undefined1 *local_a78;
  undefined8 local_a70;
  undefined1 local_a68 [16];
  code *local_a58;
  undefined1 *local_a50;
  undefined8 local_a48;
  undefined1 local_a40 [16];
  uint *local_a30;
  undefined8 local_a28;
  uint local_a20 [2];
  undefined4 uStack_a18;
  undefined4 uStack_a14;
  undefined1 *local_a10;
  undefined8 local_a08;
  undefined1 local_a00 [16];
  code *local_9f0;
  undefined1 *local_9e8;
  undefined8 local_9e0;
  undefined1 local_9d8 [16];
  uint *local_9c8;
  undefined8 local_9c0;
  uint local_9b8 [2];
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined1 *local_9a8;
  undefined8 local_9a0;
  undefined1 local_998 [16];
  code *local_988;
  undefined1 *local_980;
  undefined8 local_978;
  undefined1 local_970 [16];
  uint *local_960;
  undefined8 local_958;
  uint local_950 [2];
  undefined4 uStack_948;
  undefined4 uStack_944;
  undefined1 *local_940;
  undefined8 local_938;
  undefined1 local_930 [16];
  code *local_920;
  undefined1 *local_918;
  undefined8 local_910;
  undefined1 local_908 [16];
  uint *local_8f8;
  undefined8 local_8f0;
  uint local_8e8 [2];
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  undefined1 *local_8d8;
  undefined8 local_8d0;
  undefined1 local_8c8 [16];
  code *local_8b8;
  undefined1 *local_8b0;
  undefined8 local_8a8;
  undefined1 local_8a0 [16];
  uint *local_890;
  undefined8 local_888;
  uint local_880 [2];
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined1 *local_870;
  undefined8 local_868;
  undefined1 local_860 [16];
  code *local_850;
  undefined1 *local_848;
  undefined8 local_840;
  undefined1 local_838 [16];
  uint *local_828;
  undefined8 local_820;
  uint local_818 [2];
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined1 *local_808;
  undefined8 local_800;
  undefined1 local_7f8 [16];
  code *local_7e8;
  undefined1 *local_7e0;
  undefined8 local_7d8;
  undefined1 local_7d0 [16];
  uint *local_7c0;
  undefined8 local_7b8;
  uint local_7b0 [2];
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  undefined1 *local_7a0;
  undefined8 local_798;
  undefined1 local_790 [16];
  code *local_780;
  undefined1 *local_778;
  undefined8 local_770;
  undefined1 local_768 [16];
  uint *local_758;
  undefined8 local_750;
  uint local_748 [2];
  undefined4 uStack_740;
  undefined4 uStack_73c;
  undefined1 *local_738;
  undefined8 local_730;
  undefined1 local_728 [16];
  code *local_718;
  undefined1 *local_710;
  undefined8 local_708;
  undefined1 local_700 [16];
  undefined1 *local_6f0;
  undefined8 local_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 *local_6d0;
  undefined8 local_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  char *local_678;
  pointer local_670;
  char local_668 [8];
  ulong uStack_660;
  char *local_658;
  pointer local_650;
  char local_648 [8];
  undefined8 uStack_640;
  uint *local_638;
  undefined8 local_630;
  uint local_628 [2];
  undefined4 uStack_620;
  undefined4 uStack_61c;
  uint *local_618;
  undefined8 local_610;
  uint local_608 [2];
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined1 local_5e8 [8];
  undefined8 uStack_5e0;
  uint *local_5d8;
  size_type local_5d0;
  uint local_5c8 [2];
  undefined4 uStack_5c0;
  undefined4 uStack_5bc;
  uint *local_5b8;
  undefined8 local_5b0;
  uint local_5a8 [2];
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  uint *local_598;
  undefined8 local_590;
  uint local_588 [2];
  undefined4 uStack_580;
  undefined4 uStack_57c;
  uint *local_578;
  undefined8 local_570;
  uint local_568 [2];
  undefined4 uStack_560;
  undefined4 uStack_55c;
  uint *local_558;
  undefined8 local_550;
  uint local_548 [2];
  undefined4 uStack_540;
  undefined4 uStack_53c;
  uint *local_538;
  undefined8 local_530;
  uint local_528 [2];
  undefined4 uStack_520;
  undefined4 uStack_51c;
  uint *local_518;
  undefined8 local_510;
  uint local_508 [2];
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  uint *local_4f8;
  undefined8 local_4f0;
  uint local_4e8 [2];
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  uint *local_4d8;
  undefined8 local_4d0;
  uint local_4c8 [2];
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  uint *local_4b8;
  undefined8 local_4b0;
  uint local_4a8 [2];
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  uint *local_498;
  undefined8 local_490;
  uint local_488 [2];
  undefined4 uStack_480;
  undefined4 uStack_47c;
  uint *local_478;
  undefined8 local_470;
  uint local_468 [2];
  undefined4 uStack_460;
  undefined4 uStack_45c;
  uint *local_458;
  undefined8 local_450;
  uint local_448 [2];
  undefined4 uStack_440;
  undefined4 uStack_43c;
  uint *local_438;
  undefined8 local_430;
  uint local_428 [2];
  undefined4 uStack_420;
  undefined4 uStack_41c;
  uint *local_418;
  undefined8 local_410;
  uint local_408 [2];
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  uint *local_3f8;
  undefined8 local_3f0;
  uint local_3e8 [2];
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  uint *local_3d8;
  undefined8 local_3d0;
  uint local_3c8 [2];
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  uint *local_3b8;
  undefined8 local_3b0;
  uint local_3a8 [2];
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  uint *local_398;
  undefined8 local_390;
  uint local_388 [2];
  undefined4 uStack_380;
  undefined4 uStack_37c;
  uint *local_378;
  undefined8 local_370;
  uint local_368 [2];
  undefined4 uStack_360;
  undefined4 uStack_35c;
  uint *local_358;
  undefined8 local_350;
  uint local_348 [2];
  undefined4 uStack_340;
  undefined4 uStack_33c;
  uint *local_338;
  undefined8 local_330;
  uint local_328 [2];
  undefined4 uStack_320;
  undefined4 uStack_31c;
  uint *local_318;
  undefined8 local_310;
  uint local_308 [2];
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  uint *local_2f8;
  undefined8 local_2f0;
  uint local_2e8 [2];
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  uint *local_2d8;
  undefined8 local_2d0;
  uint local_2c8 [2];
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  uint *local_2b8;
  undefined8 local_2b0;
  uint local_2a8 [2];
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  uint *local_298;
  undefined8 local_290;
  uint local_288 [2];
  undefined4 uStack_280;
  undefined4 uStack_27c;
  uint *local_278;
  undefined8 local_270;
  uint local_268 [2];
  undefined4 uStack_260;
  undefined4 uStack_25c;
  uint *local_258;
  undefined8 local_250;
  uint local_248 [2];
  undefined4 uStack_240;
  undefined4 uStack_23c;
  uint *local_238;
  undefined8 local_230;
  uint local_228 [2];
  undefined4 uStack_220;
  undefined4 uStack_21c;
  uint *local_218;
  undefined8 local_210;
  uint local_208 [2];
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  uint *local_1f8;
  undefined8 local_1f0;
  uint local_1e8 [2];
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  uint *local_1d8;
  undefined8 local_1d0;
  uint local_1c8 [2];
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  uint *local_1b8;
  undefined8 local_1b0;
  uint local_1a8 [2];
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  uint *local_198;
  undefined8 local_190;
  uint local_188 [2];
  undefined4 uStack_180;
  undefined4 uStack_17c;
  uint *local_178;
  undefined8 local_170;
  uint local_168 [2];
  undefined4 uStack_160;
  undefined4 uStack_15c;
  uint *local_158;
  undefined8 local_150;
  uint local_148 [2];
  undefined4 uStack_140;
  undefined4 uStack_13c;
  uint *local_138;
  undefined8 local_130;
  uint local_128 [2];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  uint *local_118;
  undefined8 local_110;
  uint local_108 [2];
  undefined4 uStack_100;
  undefined4 uStack_fc;
  uint *local_f8;
  undefined8 local_f0;
  uint local_e8 [2];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uint *local_d8;
  undefined8 local_d0;
  uint local_c8 [2];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  uint *local_b8;
  undefined8 local_b0;
  uint local_a8 [2];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint *local_98;
  undefined8 local_90;
  uint local_88 [2];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint *local_78;
  undefined8 local_70;
  uint local_68 [2];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  uint *local_58;
  undefined8 local_50;
  uint local_48 [2];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  allocator_type local_31;
  
  local_678 = local_668;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"math","");
  local_658 = local_648;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_658,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\ndef sin(v) as native\ndef cos(v) as native\ndef tan(v) as native\ndef asin(v) as native\ndef acos(v) as native\ndef atan(v) as native\ndef atan2(y, x) as native\n\ndef sinh(v) as native\ndef cosh(v) as native\ndef tanh(v) as native\ndef asinh(v) as native\ndef acosh(v) as native\ndef atanh(v) as native\n\ndef exp(v) as native\ndef exp2(v) as native\ndef expm1(v) as native\ndef logn(v) as native\ndef log10(v) as native\ndef log1p(v) as native\ndef log2(v) as native\n\ndef ldexp(v, exp) as native\n\ndef _native_frexp_fraction(v) as native\ndef _native_frexp_exponent(v) as native\ndef frexp(v)\n\treturn _native_frexp_fraction(v), _native_frexp_exponent(v)\n\ndef ilogb(v) as native\ndef logb(v) as native\n\ndef _native_modf_integral(v) as native\ndef _native_modf_fractional(v) as native\ndef modf(v)\n\treturn _native_modf_integral(v), _native_modf_fractional(v)\n\ndef scalbn(v, exp)\n\treturn ldexp(v, exp)\n\ndef pow(x, y) as native\ndef sqrt(v) as native\ndef cbrt(v) as native\ndef hypot(x, y) as native\ndef abs(v) as native\n\ndef erf(v) as native\ndef erfc(v) as native\ndef tgamma(v) as native\ndef lgamma(v) as native\n\ndef ceil(v) as native\ndef floor(v) as native\ndef trunc(v) as native\ndef round(v) as native\n\ndef mod(x, y) as native\ndef remainder(x, y) as native\n\ndef nextafter(x, y) as native\n\ndef isfinite(v) as native\ndef isinf(v) as native\ndef isnan(v)..." /* TRUNCATED STRING LITERAL */
             ,"");
  if (local_678 == local_668) {
    aStack_1a18._0_8_ = uStack_660;
    local_1a30._0_8_ = local_1a30 + 0x10;
  }
  else {
    local_1a30._0_8_ = local_678;
  }
  local_1a30._8_8_ = local_670;
  local_670 = (pointer)0x0;
  local_668[0] = '\0';
  if (local_658 == local_648) {
    local_1a00._8_8_ = uStack_640;
    aStack_1a18._8_8_ = local_1a00;
  }
  else {
    aStack_1a18._8_8_ = local_658;
  }
  local_1a08._M_p = local_650;
  local_650 = (pointer)0x0;
  local_648[0] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_1a30;
  local_678 = local_668;
  local_658 = local_648;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_6b0,__l,
             (allocator_type *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((undefined1 *)aStack_1a18._8_8_ != local_1a00) {
    operator_delete((void *)aStack_1a18._8_8_);
  }
  if ((undefined1 *)local_1a30._0_8_ != local_1a30 + 0x10) {
    operator_delete((void *)local_1a30._0_8_);
  }
  if (local_658 != local_648) {
    operator_delete(local_658);
  }
  if (local_678 != local_668) {
    operator_delete(local_678);
  }
  local_5d8 = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"sin","");
  local_1a30._8_8_ = &aStack_1a18;
  local_1a30._0_8_ = math_sin;
  local_1a30._16_8_ = 0;
  aStack_1a18._0_8_ = aStack_1a18._0_8_ & 0xffffffffffffff00;
  local_1a08._M_p = local_1a00 + 8;
  if (local_5d8 == local_5c8) {
    local_1a00._16_4_ = uStack_5c0;
    local_1a00._20_4_ = uStack_5bc;
  }
  else {
    local_1a08._M_p = (pointer)local_5d8;
  }
  local_19e8._M_p = (pointer)&local_19d8;
  local_1a00._0_8_ = local_5d0;
  local_5d0 = 0;
  local_5c8[0] = local_5c8[0] & 0xffffff00;
  local_19e0 = 0;
  local_19d8._M_local_buf[0] = '\0';
  local_5d8 = local_5c8;
  local_5b8 = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"cos","");
  local_19c0 = local_19b0;
  local_19c8 = math_cos;
  local_19b8 = 0;
  local_19b0[0] = 0;
  local_19a0 = local_1990;
  if (local_5b8 == local_5a8) {
    uStack_1988 = uStack_5a0;
    uStack_1984 = uStack_59c;
  }
  else {
    local_19a0 = local_5b8;
  }
  local_1980 = local_1970;
  local_1998 = local_5b0;
  local_5b0 = 0;
  local_5a8[0] = local_5a8[0] & 0xffffff00;
  local_1978 = 0;
  local_1970[0] = 0;
  local_5b8 = local_5a8;
  local_598 = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"tan","");
  local_1958 = local_1948;
  local_1960 = math_tan;
  local_1950 = 0;
  local_1948[0] = 0;
  local_1938 = local_1928;
  if (local_598 == local_588) {
    uStack_1920 = uStack_580;
    uStack_191c = uStack_57c;
  }
  else {
    local_1938 = local_598;
  }
  local_1918 = local_1908;
  local_1930 = local_590;
  local_590 = 0;
  local_588[0] = local_588[0] & 0xffffff00;
  local_1910 = 0;
  local_1908[0] = 0;
  local_598 = local_588;
  local_578 = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"asin","");
  local_18f0 = local_18e0;
  local_18f8 = math_asin;
  local_18e8 = 0;
  local_18e0[0] = 0;
  local_18d0 = local_18c0;
  if (local_578 == local_568) {
    uStack_18b8 = uStack_560;
    uStack_18b4 = uStack_55c;
  }
  else {
    local_18d0 = local_578;
  }
  local_18b0 = local_18a0;
  local_18c8 = local_570;
  local_570 = 0;
  local_568[0] = local_568[0] & 0xffffff00;
  local_18a8 = 0;
  local_18a0[0] = 0;
  local_578 = local_568;
  local_558 = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"acos","");
  local_1888 = local_1878;
  local_1890 = math_acos;
  local_1880 = 0;
  local_1878[0] = 0;
  local_1868 = local_1858;
  if (local_558 == local_548) {
    uStack_1850 = uStack_540;
    uStack_184c = uStack_53c;
  }
  else {
    local_1868 = local_558;
  }
  local_1848 = local_1838;
  local_1860 = local_550;
  local_550 = 0;
  local_548[0] = local_548[0] & 0xffffff00;
  local_1840 = 0;
  local_1838[0] = 0;
  local_558 = local_548;
  local_538 = local_528;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"atan","");
  local_1820 = local_1810;
  local_1828 = math_atan;
  local_1818 = 0;
  local_1810[0] = 0;
  local_1800 = local_17f0;
  if (local_538 == local_528) {
    uStack_17e8 = uStack_520;
    uStack_17e4 = uStack_51c;
  }
  else {
    local_1800 = local_538;
  }
  local_17e0 = local_17d0;
  local_17f8 = local_530;
  local_530 = 0;
  local_528[0] = local_528[0] & 0xffffff00;
  local_17d8 = 0;
  local_17d0[0] = 0;
  local_538 = local_528;
  local_518 = local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"atan2","");
  local_17b8 = local_17a8;
  local_17c0 = math_atan2;
  local_17b0 = 0;
  local_17a8[0] = 0;
  local_1798 = local_1788;
  if (local_518 == local_508) {
    uStack_1780 = uStack_500;
    uStack_177c = uStack_4fc;
  }
  else {
    local_1798 = local_518;
  }
  local_1778 = local_1768;
  local_1790 = local_510;
  local_510 = 0;
  local_508[0] = local_508[0] & 0xffffff00;
  local_1770 = 0;
  local_1768[0] = 0;
  local_518 = local_508;
  local_4f8 = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"sinh","");
  local_1750 = local_1740;
  local_1758 = math_sinh;
  local_1748 = 0;
  local_1740[0] = 0;
  local_1730 = local_1720;
  if (local_4f8 == local_4e8) {
    uStack_1718 = uStack_4e0;
    uStack_1714 = uStack_4dc;
  }
  else {
    local_1730 = local_4f8;
  }
  local_1710 = local_1700;
  local_1728 = local_4f0;
  local_4f0 = 0;
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_1708 = 0;
  local_1700[0] = 0;
  local_4f8 = local_4e8;
  local_4d8 = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"cosh","");
  local_16e8 = local_16d8;
  local_16f0 = math_cosh;
  local_16e0 = 0;
  local_16d8[0] = 0;
  local_16c8 = local_16b8;
  if (local_4d8 == local_4c8) {
    uStack_16b0 = uStack_4c0;
    uStack_16ac = uStack_4bc;
  }
  else {
    local_16c8 = local_4d8;
  }
  local_16a8 = local_1698;
  local_16c0 = local_4d0;
  local_4d0 = 0;
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_16a0 = 0;
  local_1698[0] = 0;
  local_4d8 = local_4c8;
  local_4b8 = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"tanh","");
  local_1680 = local_1670;
  local_1688 = math_tanh;
  local_1678 = 0;
  local_1670[0] = 0;
  local_1660 = local_1650;
  if (local_4b8 == local_4a8) {
    uStack_1648 = uStack_4a0;
    uStack_1644 = uStack_49c;
  }
  else {
    local_1660 = local_4b8;
  }
  local_1640 = local_1630;
  local_1658 = local_4b0;
  local_4b0 = 0;
  local_4a8[0] = local_4a8[0] & 0xffffff00;
  local_1638 = 0;
  local_1630[0] = 0;
  local_4b8 = local_4a8;
  local_498 = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"asinh","");
  local_1618 = local_1608;
  local_1620 = math_asinh;
  local_1610 = 0;
  local_1608[0] = 0;
  local_15f8 = local_15e8;
  if (local_498 == local_488) {
    uStack_15e0 = uStack_480;
    uStack_15dc = uStack_47c;
  }
  else {
    local_15f8 = local_498;
  }
  local_15d8 = local_15c8;
  local_15f0 = local_490;
  local_490 = 0;
  local_488[0] = local_488[0] & 0xffffff00;
  local_15d0 = 0;
  local_15c8[0] = 0;
  local_498 = local_488;
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"acosh","");
  local_15b0 = local_15a0;
  local_15b8 = math_acosh;
  local_15a8 = 0;
  local_15a0[0] = 0;
  local_1590 = local_1580;
  if (local_478 == local_468) {
    uStack_1578 = uStack_460;
    uStack_1574 = uStack_45c;
  }
  else {
    local_1590 = local_478;
  }
  local_1570 = local_1560;
  local_1588 = local_470;
  local_470 = 0;
  local_468[0] = local_468[0] & 0xffffff00;
  local_1568 = 0;
  local_1560[0] = 0;
  local_478 = local_468;
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"atanh","");
  local_1548 = local_1538;
  local_1550 = math_atanh;
  local_1540 = 0;
  local_1538[0] = 0;
  local_1528 = local_1518;
  if (local_458 == local_448) {
    uStack_1510 = uStack_440;
    uStack_150c = uStack_43c;
  }
  else {
    local_1528 = local_458;
  }
  local_1508 = local_14f8;
  local_1520 = local_450;
  local_450 = 0;
  local_448[0] = local_448[0] & 0xffffff00;
  local_1500 = 0;
  local_14f8[0] = 0;
  local_458 = local_448;
  local_438 = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"exp","");
  local_14e0 = local_14d0;
  local_14e8 = math_exp;
  local_14d8 = 0;
  local_14d0[0] = 0;
  local_14c0 = local_14b0;
  if (local_438 == local_428) {
    uStack_14a8 = uStack_420;
    uStack_14a4 = uStack_41c;
  }
  else {
    local_14c0 = local_438;
  }
  local_14a0 = local_1490;
  local_14b8 = local_430;
  local_430 = 0;
  local_428[0] = local_428[0] & 0xffffff00;
  local_1498 = 0;
  local_1490[0] = 0;
  local_438 = local_428;
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"exp2","");
  local_1478 = local_1468;
  local_1480 = math_exp2;
  local_1470 = 0;
  local_1468[0] = 0;
  local_1458 = local_1448;
  if (local_418 == local_408) {
    uStack_1440 = uStack_400;
    uStack_143c = uStack_3fc;
  }
  else {
    local_1458 = local_418;
  }
  local_1438 = local_1428;
  local_1450 = local_410;
  local_410 = 0;
  local_408[0] = local_408[0] & 0xffffff00;
  local_1430 = 0;
  local_1428[0] = 0;
  local_418 = local_408;
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"expm1","");
  local_1410 = local_1400;
  local_1418 = math_expm1;
  local_1408 = 0;
  local_1400[0] = 0;
  local_13f0 = local_13e0;
  if (local_3f8 == local_3e8) {
    uStack_13d8 = uStack_3e0;
    uStack_13d4 = uStack_3dc;
  }
  else {
    local_13f0 = local_3f8;
  }
  local_13d0 = local_13c0;
  local_13e8 = local_3f0;
  local_3f0 = 0;
  local_3e8[0] = local_3e8[0] & 0xffffff00;
  local_13c8 = 0;
  local_13c0[0] = 0;
  local_3f8 = local_3e8;
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"logn","");
  local_13a8 = local_1398;
  local_13b0 = math_logn;
  local_13a0 = 0;
  local_1398[0] = 0;
  local_1388 = local_1378;
  if (local_3d8 == local_3c8) {
    uStack_1370 = uStack_3c0;
    uStack_136c = uStack_3bc;
  }
  else {
    local_1388 = local_3d8;
  }
  local_1368 = local_1358;
  local_1380 = local_3d0;
  local_3d0 = 0;
  local_3c8[0] = local_3c8[0] & 0xffffff00;
  local_1360 = 0;
  local_1358[0] = 0;
  local_3d8 = local_3c8;
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"log10","");
  local_1340 = local_1330;
  local_1348 = math_log10;
  local_1338 = 0;
  local_1330[0] = 0;
  local_1320 = local_1310;
  if (local_3b8 == local_3a8) {
    uStack_1308 = uStack_3a0;
    uStack_1304 = uStack_39c;
  }
  else {
    local_1320 = local_3b8;
  }
  local_1300 = local_12f0;
  local_1318 = local_3b0;
  local_3b0 = 0;
  local_3a8[0] = local_3a8[0] & 0xffffff00;
  local_12f8 = 0;
  local_12f0[0] = 0;
  local_3b8 = local_3a8;
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"log1p","");
  local_12d8 = local_12c8;
  local_12e0 = math_log1p;
  local_12d0 = 0;
  local_12c8[0] = 0;
  local_12b8 = local_12a8;
  if (local_398 == local_388) {
    uStack_12a0 = uStack_380;
    uStack_129c = uStack_37c;
  }
  else {
    local_12b8 = local_398;
  }
  local_1298 = local_1288;
  local_12b0 = local_390;
  local_390 = 0;
  local_388[0] = local_388[0] & 0xffffff00;
  local_1290 = 0;
  local_1288[0] = 0;
  local_398 = local_388;
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"log2","");
  local_1270 = local_1260;
  local_1278 = math_log2;
  local_1268 = 0;
  local_1260[0] = 0;
  local_1250 = local_1240;
  if (local_378 == local_368) {
    uStack_1238 = uStack_360;
    uStack_1234 = uStack_35c;
  }
  else {
    local_1250 = local_378;
  }
  local_1230 = local_1220;
  local_1248 = local_370;
  local_370 = 0;
  local_368[0] = local_368[0] & 0xffffff00;
  local_1228 = 0;
  local_1220[0] = 0;
  local_378 = local_368;
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"ldexp","");
  local_1208 = local_11f8;
  local_1210 = math_ldexp;
  local_1200 = 0;
  local_11f8[0] = 0;
  local_11e8 = local_11d8;
  if (local_358 == local_348) {
    uStack_11d0 = uStack_340;
    uStack_11cc = uStack_33c;
  }
  else {
    local_11e8 = local_358;
  }
  local_11c8 = local_11b8;
  local_11e0 = local_350;
  local_350 = 0;
  local_348[0] = local_348[0] & 0xffffff00;
  local_11c0 = 0;
  local_11b8[0] = 0;
  local_358 = local_348;
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"_native_frexp_fraction","");
  local_11a0 = local_1190;
  local_11a8 = math_frexp_fraction;
  local_1198 = 0;
  local_1190[0] = 0;
  local_1180 = local_1170;
  if (local_338 == local_328) {
    uStack_1168 = uStack_320;
    uStack_1164 = uStack_31c;
  }
  else {
    local_1180 = local_338;
  }
  local_1160 = local_1150;
  local_1178 = local_330;
  local_330 = 0;
  local_328[0] = local_328[0] & 0xffffff00;
  local_1158 = 0;
  local_1150[0] = 0;
  local_338 = local_328;
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"_native_frexp_exponent","");
  local_1138 = local_1128;
  local_1140 = math_frexp_exponent;
  local_1130 = 0;
  local_1128[0] = 0;
  local_1118 = local_1108;
  if (local_318 == local_308) {
    uStack_1100 = uStack_300;
    uStack_10fc = uStack_2fc;
  }
  else {
    local_1118 = local_318;
  }
  local_10f8 = local_10e8;
  local_1110 = local_310;
  local_310 = 0;
  local_308[0] = local_308[0] & 0xffffff00;
  local_10f0 = 0;
  local_10e8[0] = 0;
  local_318 = local_308;
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"ilogb","");
  local_10d0 = local_10c0;
  local_10d8 = math_ilogb;
  local_10c8 = 0;
  local_10c0[0] = 0;
  local_10b0 = local_10a0;
  if (local_2f8 == local_2e8) {
    uStack_1098 = uStack_2e0;
    uStack_1094 = uStack_2dc;
  }
  else {
    local_10b0 = local_2f8;
  }
  local_1090 = local_1080;
  local_10a8 = local_2f0;
  local_2f0 = 0;
  local_2e8[0] = local_2e8[0] & 0xffffff00;
  local_1088 = 0;
  local_1080[0] = 0;
  local_2f8 = local_2e8;
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"logb","");
  local_1068 = local_1058;
  local_1070 = math_logb;
  local_1060 = 0;
  local_1058[0] = 0;
  local_1048 = local_1038;
  if (local_2d8 == local_2c8) {
    uStack_1030 = uStack_2c0;
    uStack_102c = uStack_2bc;
  }
  else {
    local_1048 = local_2d8;
  }
  local_1028 = local_1018;
  local_1040 = local_2d0;
  local_2d0 = 0;
  local_2c8[0] = local_2c8[0] & 0xffffff00;
  local_1020 = 0;
  local_1018[0] = 0;
  local_2d8 = local_2c8;
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"_native_modf_integral","");
  local_1000 = local_ff0;
  local_1008 = math_modf_integral;
  local_ff8 = 0;
  local_ff0[0] = 0;
  local_fe0 = local_fd0;
  if (local_2b8 == local_2a8) {
    uStack_fc8 = uStack_2a0;
    uStack_fc4 = uStack_29c;
  }
  else {
    local_fe0 = local_2b8;
  }
  local_fc0 = local_fb0;
  local_fd8 = local_2b0;
  local_2b0 = 0;
  local_2a8[0] = local_2a8[0] & 0xffffff00;
  local_fb8 = 0;
  local_fb0[0] = 0;
  local_2b8 = local_2a8;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"_native_modf_fractional","")
  ;
  local_f98 = local_f88;
  local_fa0 = math_modf_fractional;
  local_f90 = 0;
  local_f88[0] = 0;
  local_f78 = local_f68;
  if (local_298 == local_288) {
    uStack_f60 = uStack_280;
    uStack_f5c = uStack_27c;
  }
  else {
    local_f78 = local_298;
  }
  local_f58 = local_f48;
  local_f70 = local_290;
  local_290 = 0;
  local_288[0] = local_288[0] & 0xffffff00;
  local_f50 = 0;
  local_f48[0] = 0;
  local_298 = local_288;
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"pow","");
  local_f30 = local_f20;
  local_f38 = math_pow;
  local_f28 = 0;
  local_f20[0] = 0;
  local_f10 = local_f00;
  if (local_278 == local_268) {
    uStack_ef8 = uStack_260;
    uStack_ef4 = uStack_25c;
  }
  else {
    local_f10 = local_278;
  }
  local_ef0 = local_ee0;
  local_f08 = local_270;
  local_270 = 0;
  local_268[0] = local_268[0] & 0xffffff00;
  local_ee8 = 0;
  local_ee0[0] = 0;
  local_278 = local_268;
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"sqrt","");
  local_ec8 = local_eb8;
  local_ed0 = math_sqrt;
  local_ec0 = 0;
  local_eb8[0] = 0;
  local_ea8 = local_e98;
  if (local_258 == local_248) {
    uStack_e90 = uStack_240;
    uStack_e8c = uStack_23c;
  }
  else {
    local_ea8 = local_258;
  }
  local_e88 = local_e78;
  local_ea0 = local_250;
  local_250 = 0;
  local_248[0] = local_248[0] & 0xffffff00;
  local_e80 = 0;
  local_e78[0] = 0;
  local_258 = local_248;
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"cbrt","");
  local_e60 = local_e50;
  local_e68 = math_cbrt;
  local_e58 = 0;
  local_e50[0] = 0;
  local_e40 = local_e30;
  if (local_238 == local_228) {
    uStack_e28 = uStack_220;
    uStack_e24 = uStack_21c;
  }
  else {
    local_e40 = local_238;
  }
  local_e20 = local_e10;
  local_e38 = local_230;
  local_230 = 0;
  local_228[0] = local_228[0] & 0xffffff00;
  local_e18 = 0;
  local_e10[0] = 0;
  local_238 = local_228;
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"hypot","");
  local_df8 = local_de8;
  local_e00 = math_hypot;
  local_df0 = 0;
  local_de8[0] = 0;
  local_dd8 = local_dc8;
  if (local_218 == local_208) {
    uStack_dc0 = uStack_200;
    uStack_dbc = uStack_1fc;
  }
  else {
    local_dd8 = local_218;
  }
  local_db8 = local_da8;
  local_dd0 = local_210;
  local_210 = 0;
  local_208[0] = local_208[0] & 0xffffff00;
  local_db0 = 0;
  local_da8[0] = 0;
  local_218 = local_208;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"abs","");
  local_d90 = local_d80;
  local_d98 = math_abs;
  local_d88 = 0;
  local_d80[0] = 0;
  local_d70 = local_d60;
  if (local_1f8 == local_1e8) {
    uStack_d58 = uStack_1e0;
    uStack_d54 = uStack_1dc;
  }
  else {
    local_d70 = local_1f8;
  }
  local_d50 = local_d40;
  local_d68 = local_1f0;
  local_1f0 = 0;
  local_1e8[0] = local_1e8[0] & 0xffffff00;
  local_d48 = 0;
  local_d40[0] = 0;
  local_1f8 = local_1e8;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"erf","");
  local_d28 = local_d18;
  local_d30 = math_erf;
  local_d20 = 0;
  local_d18[0] = 0;
  local_d08 = local_cf8;
  if (local_1d8 == local_1c8) {
    uStack_cf0 = uStack_1c0;
    uStack_cec = uStack_1bc;
  }
  else {
    local_d08 = local_1d8;
  }
  local_ce8 = local_cd8;
  local_d00 = local_1d0;
  local_1d0 = 0;
  local_1c8[0] = local_1c8[0] & 0xffffff00;
  local_ce0 = 0;
  local_cd8[0] = 0;
  local_1d8 = local_1c8;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"erfc","");
  local_cc0 = local_cb0;
  local_cc8 = math_erfc;
  local_cb8 = 0;
  local_cb0[0] = 0;
  local_ca0 = local_c90;
  if (local_1b8 == local_1a8) {
    uStack_c88 = uStack_1a0;
    uStack_c84 = uStack_19c;
  }
  else {
    local_ca0 = local_1b8;
  }
  local_c80 = local_c70;
  local_c98 = local_1b0;
  local_1b0 = 0;
  local_1a8[0] = local_1a8[0] & 0xffffff00;
  local_c78 = 0;
  local_c70[0] = 0;
  local_1b8 = local_1a8;
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"tgamma","");
  local_c58 = local_c48;
  local_c60 = math_tgamma;
  local_c50 = 0;
  local_c48[0] = 0;
  local_c38 = local_c28;
  if (local_198 == local_188) {
    uStack_c20 = uStack_180;
    uStack_c1c = uStack_17c;
  }
  else {
    local_c38 = local_198;
  }
  local_c18 = local_c08;
  local_c30 = local_190;
  local_190 = 0;
  local_188[0] = local_188[0] & 0xffffff00;
  local_c10 = 0;
  local_c08[0] = 0;
  local_198 = local_188;
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"lgamma","");
  local_bf0 = local_be0;
  local_bf8 = math_lgamma;
  local_be8 = 0;
  local_be0[0] = 0;
  local_bd0 = local_bc0;
  if (local_178 == local_168) {
    uStack_bb8 = uStack_160;
    uStack_bb4 = uStack_15c;
  }
  else {
    local_bd0 = local_178;
  }
  local_bb0 = local_ba0;
  local_bc8 = local_170;
  local_170 = 0;
  local_168[0] = local_168[0] & 0xffffff00;
  local_ba8 = 0;
  local_ba0[0] = 0;
  local_178 = local_168;
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"ceil","");
  local_b88 = local_b78;
  local_b90 = math_ceil;
  local_b80 = 0;
  local_b78[0] = 0;
  local_b68 = local_b58;
  if (local_158 == local_148) {
    uStack_b50 = uStack_140;
    uStack_b4c = uStack_13c;
  }
  else {
    local_b68 = local_158;
  }
  local_b48 = local_b38;
  local_b60 = local_150;
  local_150 = 0;
  local_148[0] = local_148[0] & 0xffffff00;
  local_b40 = 0;
  local_b38[0] = 0;
  local_158 = local_148;
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"floor","");
  local_b20 = local_b10;
  local_b28 = math_floor;
  local_b18 = 0;
  local_b10[0] = 0;
  local_b00 = local_af0;
  if (local_138 == local_128) {
    uStack_ae8 = uStack_120;
    uStack_ae4 = uStack_11c;
  }
  else {
    local_b00 = local_138;
  }
  local_ae0 = local_ad0;
  local_af8 = local_130;
  local_130 = 0;
  local_128[0] = local_128[0] & 0xffffff00;
  local_ad8 = 0;
  local_ad0[0] = 0;
  local_138 = local_128;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"trunc","");
  local_ab8 = local_aa8;
  local_ac0 = math_trunc;
  local_ab0 = 0;
  local_aa8[0] = 0;
  local_a98 = local_a88;
  if (local_118 == local_108) {
    uStack_a80 = uStack_100;
    uStack_a7c = uStack_fc;
  }
  else {
    local_a98 = local_118;
  }
  local_a78 = local_a68;
  local_a90 = local_110;
  local_110 = 0;
  local_108[0] = local_108[0] & 0xffffff00;
  local_a70 = 0;
  local_a68[0] = 0;
  local_118 = local_108;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"round","");
  local_a50 = local_a40;
  local_a58 = math_round;
  local_a48 = 0;
  local_a40[0] = 0;
  local_a30 = local_a20;
  if (local_f8 == local_e8) {
    uStack_a18 = uStack_e0;
    uStack_a14 = uStack_dc;
  }
  else {
    local_a30 = local_f8;
  }
  local_a10 = local_a00;
  local_a28 = local_f0;
  local_f0 = 0;
  local_e8[0] = local_e8[0] & 0xffffff00;
  local_a08 = 0;
  local_a00[0] = 0;
  local_f8 = local_e8;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"mod","");
  local_9e8 = local_9d8;
  local_9f0 = math_mod;
  local_9e0 = 0;
  local_9d8[0] = 0;
  local_9c8 = local_9b8;
  if (local_d8 == local_c8) {
    uStack_9b0 = uStack_c0;
    uStack_9ac = uStack_bc;
  }
  else {
    local_9c8 = local_d8;
  }
  local_9a8 = local_998;
  local_9c0 = local_d0;
  local_d0 = 0;
  local_c8[0] = local_c8[0] & 0xffffff00;
  local_9a0 = 0;
  local_998[0] = 0;
  local_d8 = local_c8;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"remainder","");
  local_980 = local_970;
  local_988 = math_remainder;
  local_978 = 0;
  local_970[0] = 0;
  local_960 = local_950;
  if (local_b8 == local_a8) {
    uStack_948 = uStack_a0;
    uStack_944 = uStack_9c;
  }
  else {
    local_960 = local_b8;
  }
  local_940 = local_930;
  local_958 = local_b0;
  local_b0 = 0;
  local_a8[0] = local_a8[0] & 0xffffff00;
  local_938 = 0;
  local_930[0] = 0;
  local_b8 = local_a8;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"nextafter","");
  local_918 = local_908;
  local_920 = math_nextafter;
  local_910 = 0;
  local_908[0] = 0;
  local_8f8 = local_8e8;
  if (local_98 == local_88) {
    uStack_8e0 = uStack_80;
    uStack_8dc = uStack_7c;
  }
  else {
    local_8f8 = local_98;
  }
  local_8d8 = local_8c8;
  local_8f0 = local_90;
  local_90 = 0;
  local_88[0] = local_88[0] & 0xffffff00;
  local_8d0 = 0;
  local_8c8[0] = 0;
  local_98 = local_88;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"isfinite","");
  local_8b0 = local_8a0;
  local_8b8 = math_isfinite;
  local_8a8 = 0;
  local_8a0[0] = 0;
  local_890 = local_880;
  if (local_78 == local_68) {
    uStack_878 = uStack_60;
    uStack_874 = uStack_5c;
  }
  else {
    local_890 = local_78;
  }
  local_870 = local_860;
  local_888 = local_70;
  local_70 = 0;
  local_68[0] = local_68[0] & 0xffffff00;
  local_868 = 0;
  local_860[0] = 0;
  local_78 = local_68;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"isinf","");
  local_848 = local_838;
  local_850 = math_isinf;
  local_840 = 0;
  local_838[0] = 0;
  local_828 = local_818;
  if (local_58 == local_48) {
    uStack_810 = uStack_40;
    uStack_80c = uStack_3c;
  }
  else {
    local_828 = local_58;
  }
  local_808 = local_7f8;
  local_820 = local_50;
  local_50 = 0;
  local_48[0] = local_48[0] & 0xffffff00;
  local_800 = 0;
  local_7f8[0] = 0;
  local_638 = local_628;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"isnan","");
  local_7e0 = local_7d0;
  local_7e8 = math_isnan;
  local_7d8 = 0;
  local_7d0[0] = 0;
  local_7c0 = local_7b0;
  if (local_638 == local_628) {
    uStack_7a8 = uStack_620;
    uStack_7a4 = uStack_61c;
  }
  else {
    local_7c0 = local_638;
  }
  local_7a0 = local_790;
  local_7b8 = local_630;
  local_630 = 0;
  local_628[0] = local_628[0] & 0xffffff00;
  local_798 = 0;
  local_790[0] = 0;
  local_638 = local_628;
  local_618 = local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"isnormal","");
  local_778 = local_768;
  local_780 = math_isnormal;
  local_770 = 0;
  local_768[0] = 0;
  local_758 = local_748;
  if (local_618 == local_608) {
    uStack_740 = uStack_600;
    uStack_73c = uStack_5fc;
  }
  else {
    local_758 = local_618;
  }
  local_738 = local_728;
  local_750 = local_610;
  local_610 = 0;
  local_608[0] = local_608[0] & 0xffffff00;
  local_730 = 0;
  local_728[0] = 0;
  local_618 = local_608;
  local_5f8 = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"signbit","");
  local_710 = local_700;
  local_718 = math_signbit;
  local_708 = 0;
  local_700[0] = 0;
  local_6f0 = local_6e0;
  if (local_5f8 == local_5e8) {
    uStack_6d8 = uStack_5e0;
  }
  else {
    local_6f0 = local_5f8;
  }
  puVar2 = local_6c0;
  local_6e8 = local_5f0;
  local_5f0 = 0;
  local_5e8[0] = 0;
  local_6c8 = 0;
  local_6c0[0] = 0;
  __l_00._M_len = 0x30;
  __l_00._M_array = (iterator)local_1a30;
  local_6d0 = puVar2;
  local_5f8 = local_5e8;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,&local_31);
  lVar1 = -0x1380;
  do {
    if (puVar2 != *(undefined1 **)(puVar2 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar2 + -0x10));
    }
    if (puVar2 + -0x20 != *(undefined1 **)(puVar2 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar2 + -0x30));
    }
    if (puVar2 + -0x40 != *(undefined1 **)(puVar2 + -0x50)) {
      operator_delete(*(undefined1 **)(puVar2 + -0x50));
    }
    puVar2 = puVar2 + -0x68;
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0);
  if (local_5f8 != local_5e8) {
    operator_delete(local_5f8);
  }
  if (local_618 != local_608) {
    operator_delete(local_618);
  }
  if (local_638 != local_628) {
    operator_delete(local_638);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  if (local_338 != local_328) {
    operator_delete(local_338);
  }
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  if (local_378 != local_368) {
    operator_delete(local_378);
  }
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  if (local_478 != local_468) {
    operator_delete(local_478);
  }
  if (local_498 != local_488) {
    operator_delete(local_498);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8);
  }
  if (local_518 != local_508) {
    operator_delete(local_518);
  }
  if (local_538 != local_528) {
    operator_delete(local_538);
  }
  if (local_558 != local_548) {
    operator_delete(local_558);
  }
  if (local_578 != local_568) {
    operator_delete(local_578);
  }
  if (local_598 != local_588) {
    operator_delete(local_598);
  }
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8);
  }
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8);
  }
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_6b0);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_6b0);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"math", script}};
	std::vector<HandlerInfo> handlers = {
			{math_sin, "sin"},
			{math_cos, "cos"},
			{math_tan, "tan"},
			{math_asin, "asin"},
			{math_acos, "acos"},
			{math_atan, "atan"},
			{math_atan2, "atan2"},

			{math_sinh, "sinh"},
			{math_cosh, "cosh"},
			{math_tanh, "tanh"},
			{math_asinh, "asinh"},
			{math_acosh, "acosh"},
			{math_atanh, "atanh"},

			{math_exp, "exp"},
			{math_exp2, "exp2"},
			{math_expm1, "expm1"},
			{math_logn, "logn"},
			{math_log10, "log10"},
			{math_log1p, "log1p"},
			{math_log2, "log2"},

			{math_ldexp, "ldexp"},
			{math_frexp_fraction, "_native_frexp_fraction"},
			{math_frexp_exponent, "_native_frexp_exponent"},
			{math_ilogb, "ilogb"},
			{math_logb, "logb"},
			{math_modf_integral, "_native_modf_integral"},
			{math_modf_fractional, "_native_modf_fractional"},

			{math_pow, "pow"},
			{math_sqrt, "sqrt"},
			{math_cbrt, "cbrt"},
			{math_hypot, "hypot"},
			{math_abs, "abs"},

			{math_erf, "erf"},
			{math_erfc, "erfc"},
			{math_tgamma, "tgamma"},
			{math_lgamma, "lgamma"},

			{math_ceil, "ceil"},
			{math_floor, "floor"},
			{math_trunc, "trunc"},
			{math_round, "round"},

			{math_mod, "mod"},
			{math_remainder, "remainder"},
			{math_nextafter, "nextafter"},

			{math_isfinite, "isfinite"},
			{math_isinf, "isinf"},
			{math_isnan, "isnan"},
			{math_isnormal, "isnormal"},
			{math_signbit, "signbit"},
	};
	return {scripts, handlers, nullptr};
}